

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::GetKeyPressedAmount(ImGuiKey key,float repeat_delay,float repeat_rate)

{
  ImGuiContext *pIVar1;
  ImGuiKeyData *pIVar2;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float t;
  ImGuiKeyData *key_data;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffe0;
  int local_4;
  
  pIVar1 = GImGui;
  pIVar2 = GetKeyData((ImGuiKey)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if ((pIVar2->Down & 1U) == 0) {
    local_4 = 0;
  }
  else {
    local_4 = CalcTypematicRepeatAmount
                        (pIVar2->DownDuration - (pIVar1->IO).DeltaTime,pIVar2->DownDuration,
                         in_XMM0_Da,in_XMM1_Da);
  }
  return local_4;
}

Assistant:

int ImGui::GetKeyPressedAmount(ImGuiKey key, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return 0;
    const float t = key_data->DownDuration;
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}